

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O3

EStatusCode __thiscall
CFFPrimitiveReader::Read(CFFPrimitiveReader *this,Byte *ioBuffer,LongBufferSizeType inBufferSize)

{
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  
  EVar1 = eFailure;
  if (this->mInternalState != eFailure) {
    iVar2 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])();
    EVar1 = eSuccess;
    if (CONCAT44(extraout_var,iVar2) != inBufferSize) {
      this->mInternalState = eFailure;
      EVar1 = eFailure;
    }
  }
  return EVar1;
}

Assistant:

EStatusCode CFFPrimitiveReader::Read(Byte* ioBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mCFFFile->Read(ioBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}